

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::pair<google::protobuf::Message_const*,std::__cxx11::string>&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
          *args_1,tuple<> *args_2)

{
  bool bVar1;
  reference args_00;
  FindElement local_50;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  construct<std::piecewise_construct_t_const&,std::tuple<std::pair<google::protobuf::Message_const*,std::__cxx11::string>&&>,std::tuple<>>
            (this,local_38.field_1.slot_,args,args_1,args_2);
  local_50.s = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
                *)this;
  args_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
            ::iterator::operator*(&local_38);
  local_28 = (iterator)
             DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>::FindElement,std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>&>
                       (&local_50,args_00);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar1 = container_internal::operator==(&local_28,&local_48);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>, Args = <const std::piecewise_construct_t &, std::tuple<std::pair<const google::protobuf::Message *, std::basic_string<char>> &&>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }